

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_fixline(FuncState *fs,int line)

{
  int line_local;
  FuncState *fs_local;
  
  removelastlineinfo(fs);
  savelineinfo(fs,fs->f,line);
  return;
}

Assistant:

void luaK_fixline (FuncState *fs, int line) {
  removelastlineinfo(fs);
  savelineinfo(fs, fs->f, line);
}